

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O1

void * sndio_mainloop(void *arg)

{
  pthread_mutex_t *__mutex;
  float fVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  pollfd *__fds;
  long lVar7;
  long lVar8;
  size_t sVar9;
  short *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  byte bVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  ulong local_40;
  
  iVar4 = (*cubeb_sio_nfds)(*(sio_hdl **)((long)arg + 0x40));
  __fds = (pollfd *)calloc((long)iVar4,8);
  if (__fds != (pollfd *)0x0) {
    (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),0);
    __mutex = (pthread_mutex_t *)((long)arg + 0x18);
    pthread_mutex_lock(__mutex);
    iVar4 = (*cubeb_sio_start)(*(sio_hdl **)((long)arg + 0x40));
    if (iVar4 == 0) {
      pthread_mutex_unlock(__mutex);
    }
    else {
      iVar4 = *(int *)((long)arg + 0x68);
      if ((*(uint *)((long)arg + 0x48) & 1) == 0) {
        uVar11 = (ulong)(uint)(iVar4 * *(int *)((long)arg + 0x6c));
        iVar17 = 0;
        uVar5 = 0;
        uVar16 = 0;
      }
      else {
        uVar5 = *(int *)((long)arg + 0x70) * iVar4;
        iVar17 = *(int *)((long)arg + 0x7c);
        if ((*(uint *)((long)arg + 0x48) & 2) == 0) {
          uVar11 = 0;
          uVar16 = 0;
        }
        else {
          memset(*(void **)((long)arg + 0x58),0,(ulong)(uint)(iVar4 * *(int *)((long)arg + 0x6c)));
          uVar11 = (ulong)(uint)(*(int *)((long)arg + 0x6c) * *(int *)((long)arg + 0x68));
          uVar16 = uVar11;
        }
      }
      if (*(int *)((long)arg + 0x4c) != 0) {
        uVar13 = (ulong)uVar5;
        bVar3 = false;
        local_40 = uVar13;
        do {
          uVar5 = *(uint *)((long)arg + 0x48);
          if ((((uVar5 & 1) == 0) || (uVar13 == local_40)) &&
             (((uVar5 & 2) == 0 || (uVar16 == uVar11)))) {
            uVar12 = 2;
            if (bVar3) goto LAB_001117fc;
            if ((((uVar5 & 2) != 0) && (*(int *)((long)arg + 0x50) != 0)) &&
               (uVar5 = *(int *)((long)arg + 0x74) * *(int *)((long)arg + 0x68), uVar5 != 0)) {
              lVar8 = *(long *)((long)arg + 0x58);
              lVar7 = (ulong)uVar5 + 1;
              do {
                *(float *)(lVar8 + -8 + lVar7 * 4) =
                     (float)*(int *)(lVar8 + -8 + lVar7 * 4) * 1.1920929e-07;
                lVar7 = lVar7 + -1;
              } while (1 < lVar7);
            }
            pthread_mutex_unlock(__mutex);
            lVar8 = (**(code **)((long)arg + 0x90))
                              (arg,*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x58),
                               *(undefined8 *)((long)arg + 0x60),*(undefined4 *)((long)arg + 0x68));
            pthread_mutex_lock(__mutex);
            if (lVar8 < 0) {
              uVar12 = 3;
              goto LAB_001117fc;
            }
            *(long *)((long)arg + 0x88) = *(long *)((long)arg + 0x88) + lVar8;
            bVar3 = false;
            if (lVar8 < (long)(ulong)*(uint *)((long)arg + 0x68)) {
              if (((*(byte *)((long)arg + 0x48) & 1) == 0) || (lVar8 == 0)) goto LAB_001117fc;
              local_40 = (ulong)*(uint *)((long)arg + 0x70) * lVar8;
              bVar3 = true;
            }
            if ((*(byte *)((long)arg + 0x48) & 1) != 0) {
              if (*(int *)((long)arg + 0x50) == 0) {
                lVar8 = lVar8 * (ulong)*(uint *)((long)arg + 0x78);
                fVar1 = *(float *)((long)arg + 0xa0);
                if (0 < lVar8) {
                  psVar10 = *(short **)((long)arg + 0x60);
                  lVar8 = lVar8 + 1;
                  do {
                    *psVar10 = (short)((uint)((int)*psVar10 * (int)(fVar1 * 32768.0)) >> 0xf);
                    psVar10 = psVar10 + 1;
                    lVar8 = lVar8 + -1;
                  } while (1 < lVar8);
                }
              }
              else {
                lVar8 = lVar8 * (ulong)*(uint *)((long)arg + 0x78);
                fVar1 = *(float *)((long)arg + 0xa0);
                if (0 < lVar8) {
                  pfVar15 = *(float **)((long)arg + 0x60);
                  lVar8 = lVar8 + 1;
                  do {
                    lVar7 = lrintf(*pfVar15 * fVar1 * 8388608.0);
                    fVar6 = (float)lVar7;
                    if (0x7ffffe < (int)fVar6) {
                      fVar6 = 1.1754942e-38;
                    }
                    if ((int)fVar6 < -0x7fffff) {
                      fVar6 = -INFINITY;
                    }
                    *pfVar15 = fVar6;
                    pfVar15 = pfVar15 + 1;
                    lVar8 = lVar8 + -1;
                  } while (1 < lVar8);
                }
              }
            }
            iVar17 = iVar17 - (uint)(0 < iVar17);
            if ((*(uint *)((long)arg + 0x48) & 2) != 0) {
              uVar16 = 0;
            }
            if ((*(uint *)((long)arg + 0x48) & 1) != 0) {
              uVar13 = 0;
            }
          }
          bVar14 = (iVar17 == 0 && (uVar16 <= uVar11 && uVar11 - uVar16 != 0)) &
                   *(byte *)((long)arg + 0x48) >> 1;
          bVar2 = bVar14 + 4;
          if (local_40 < uVar13 || local_40 - uVar13 == 0) {
            bVar2 = bVar14;
          }
          if ((*(byte *)((long)arg + 0x48) & 1) == 0) {
            bVar2 = bVar14;
          }
          uVar5 = (*cubeb_sio_pollfd)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds,(int)bVar2);
          if ((int)uVar5 < 1) {
LAB_001116ce:
            uVar5 = (*cubeb_sio_revents)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds);
            uVar12 = 3;
            if ((uVar5 & 0x10) != 0) goto LAB_001117fc;
            if ((uVar5 & 4) != 0) {
              sVar9 = (*cubeb_sio_write)(*(sio_hdl **)((long)arg + 0x40),
                                         (void *)(*(long *)((long)arg + 0x60) + uVar13),
                                         local_40 - uVar13);
              if (((int)sVar9 == 0) &&
                 (iVar4 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar4 != 0))
              goto LAB_001117fc;
              uVar13 = uVar13 + (long)(int)sVar9;
            }
            if ((uVar5 & 1) != 0) {
              sVar9 = (*cubeb_sio_read)(*(sio_hdl **)((long)arg + 0x40),
                                        (void *)(*(long *)((long)arg + 0x58) + uVar16),
                                        uVar11 - uVar16);
              if (((int)sVar9 == 0) &&
                 (iVar4 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar4 != 0))
              goto LAB_001117fc;
              uVar16 = uVar16 + (long)(int)sVar9;
            }
            if ((0 < iVar17) && ((*(byte *)((long)arg + 0x48) & 2) != 0)) {
              uVar16 = uVar11;
            }
          }
          else {
            pthread_mutex_unlock(__mutex);
            iVar4 = poll(__fds,(ulong)uVar5,-1);
            pthread_mutex_lock(__mutex);
            if (-1 < iVar4) goto LAB_001116ce;
          }
        } while (*(int *)((long)arg + 0x4c) != 0);
      }
      uVar12 = 1;
LAB_001117fc:
      (*cubeb_sio_stop)(*(sio_hdl **)((long)arg + 0x40));
      *(undefined8 *)((long)arg + 0x80) = *(undefined8 *)((long)arg + 0x88);
      pthread_mutex_unlock(__mutex);
      (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),uVar12);
    }
    free(__fds);
  }
  return (void *)0x0;
}

Assistant:

static void *
sndio_mainloop(void * arg)
{
  struct pollfd * pfds;
  cubeb_stream * s = arg;
  int n, eof = 0, prime, nfds, events, revents, state = CUBEB_STATE_STARTED;
  size_t pstart = 0, pend = 0, rstart = 0, rend = 0;
  long nfr;

  CUBEB_REGISTER_THREAD("cubeb rendering thread");

  nfds = WRAP(sio_nfds)(s->hdl);
  pfds = calloc(nfds, sizeof(struct pollfd));
  if (pfds == NULL) {
    CUBEB_UNREGISTER_THREAD();
    return NULL;
  }

  DPR("sndio_mainloop()\n");
  s->state_cb(s, s->arg, CUBEB_STATE_STARTED);
  pthread_mutex_lock(&s->mtx);
  if (!WRAP(sio_start)(s->hdl)) {
    pthread_mutex_unlock(&s->mtx);
    free(pfds);
    CUBEB_UNREGISTER_THREAD();
    return NULL;
  }
  DPR("sndio_mainloop(), started\n");

  if (s->mode & SIO_PLAY) {
    pstart = pend = s->nfr * s->pbpf;
    prime = s->nblks;
    if (s->mode & SIO_REC) {
      memset(s->rbuf, 0, s->nfr * s->rbpf);
      rstart = rend = s->nfr * s->rbpf;
    }
  } else {
    prime = 0;
    rstart = 0;
    rend = s->nfr * s->rbpf;
  }

  for (;;) {
    if (!s->active) {
      DPR("sndio_mainloop() stopped\n");
      state = CUBEB_STATE_STOPPED;
      break;
    }

    /* do we have a complete block? */
    if ((!(s->mode & SIO_PLAY) || pstart == pend) &&
        (!(s->mode & SIO_REC) || rstart == rend)) {

      if (eof) {
        DPR("sndio_mainloop() drained\n");
        state = CUBEB_STATE_DRAINED;
        break;
      }

      if ((s->mode & SIO_REC) && s->conv)
        s24_to_float(s->rbuf, s->nfr * s->rchan);

      /* invoke call-back, it returns less that s->nfr if done */
      pthread_mutex_unlock(&s->mtx);
      nfr = s->data_cb(s, s->arg, s->rbuf, s->pbuf, s->nfr);
      pthread_mutex_lock(&s->mtx);
      if (nfr < 0) {
        DPR("sndio_mainloop() cb err\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      s->swpos += nfr;

      /* was this last call-back invocation (aka end-of-stream) ? */
      if (nfr < s->nfr) {

        if (!(s->mode & SIO_PLAY) || nfr == 0) {
          state = CUBEB_STATE_DRAINED;
          break;
        }

        /* need to write (aka drain) the partial play block we got */
        pend = nfr * s->pbpf;
        eof = 1;
      }

      if (prime > 0)
        prime--;

      if (s->mode & SIO_PLAY) {
        if (s->conv)
          float_to_s24(s->pbuf, nfr * s->pchan, s->volume);
        else
          s16_setvol(s->pbuf, nfr * s->pchan, s->volume);
      }

      if (s->mode & SIO_REC)
        rstart = 0;
      if (s->mode & SIO_PLAY)
        pstart = 0;
    }

    events = 0;
    if ((s->mode & SIO_REC) && rstart < rend && prime == 0)
      events |= POLLIN;
    if ((s->mode & SIO_PLAY) && pstart < pend)
      events |= POLLOUT;
    nfds = WRAP(sio_pollfd)(s->hdl, pfds, events);

    if (nfds > 0) {
      pthread_mutex_unlock(&s->mtx);
      n = poll(pfds, nfds, -1);
      pthread_mutex_lock(&s->mtx);
      if (n < 0)
        continue;
    }

    revents = WRAP(sio_revents)(s->hdl, pfds);

    if (revents & POLLHUP) {
      state = CUBEB_STATE_ERROR;
      break;
    }

    if (revents & POLLOUT) {
      n = WRAP(sio_write)(s->hdl, s->pbuf + pstart, pend - pstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() werr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      pstart += n;
    }

    if (revents & POLLIN) {
      n = WRAP(sio_read)(s->hdl, s->rbuf + rstart, rend - rstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() rerr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      rstart += n;
    }

    /* skip rec block, if not recording (yet) */
    if (prime > 0 && (s->mode & SIO_REC))
      rstart = rend;
  }
  WRAP(sio_stop)(s->hdl);
  s->hwpos = s->swpos;
  pthread_mutex_unlock(&s->mtx);
  s->state_cb(s, s->arg, state);
  free(pfds);
  CUBEB_UNREGISTER_THREAD();
  return NULL;
}